

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TreePatterns.cpp
# Opt level: O0

bool __thiscall
IRT::MoveMemFromConstPattern::TryToGenerateCode
          (MoveMemFromConstPattern *this,INode *tree,CTemp *dest,ChildrenTemps *children,
          AssemblyCommands *commands)

{
  ConstMemPtr this_00;
  ChildrenTemps *__args_1;
  CExpression *pCVar1;
  CConstExpression *local_90;
  CMemExpression *local_80;
  undefined1 local_58 [24];
  ConstConstPtr constPtr;
  ConstMemPtr memPtr;
  AssemblyCommands *commands_local;
  ChildrenTemps *children_local;
  CTemp *dest_local;
  INode *tree_local;
  MoveMemFromConstPattern *this_local;
  
  memPtr = (ConstMemPtr)commands;
  commands_local = (AssemblyCommands *)children;
  children_local = (ChildrenTemps *)dest;
  dest_local = (CTemp *)tree;
  tree_local = (INode *)this;
  if (tree == (INode *)0x0) {
    local_80 = (CMemExpression *)0x0;
  }
  else {
    local_80 = (CMemExpression *)__dynamic_cast(tree,&INode::typeinfo,&CMemExpression::typeinfo,0);
  }
  constPtr = (ConstConstPtr)local_80;
  if (local_80 != (CMemExpression *)0x0) {
    pCVar1 = CMemExpression::getAddress(local_80);
    if (pCVar1 == (CExpression *)0x0) {
      local_90 = (CConstExpression *)0x0;
    }
    else {
      local_90 = (CConstExpression *)
                 __dynamic_cast(pCVar1,&CExpression::typeinfo,&CConstExpression::typeinfo,0);
    }
    __args_1 = children_local;
    this_00 = memPtr;
    local_58._16_8_ = local_90;
    if (local_90 != (CConstExpression *)0x0) {
      CConstExpression::getValue(local_90);
      std::make_shared<AssemblyCode::MoveMemFromConstCommand,IRT::CTemp_const&,int>
                ((CTemp *)local_58,(int *)__args_1);
      std::
      vector<std::shared_ptr<AssemblyCode::AssemblyCommand>,std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>>>
      ::emplace_back<std::shared_ptr<AssemblyCode::MoveMemFromConstCommand>>
                ((vector<std::shared_ptr<AssemblyCode::AssemblyCommand>,std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>>>
                  *)this_00,(shared_ptr<AssemblyCode::MoveMemFromConstCommand> *)local_58);
      std::shared_ptr<AssemblyCode::MoveMemFromConstCommand>::~shared_ptr
                ((shared_ptr<AssemblyCode::MoveMemFromConstCommand> *)local_58);
      return true;
    }
  }
  return false;
}

Assistant:

bool
IRT::MoveMemFromConstPattern::TryToGenerateCode( const IRT::INode *tree, const IRT::CTemp &dest,
                                                 ChildrenTemps &children,
                                                 AssemblyCommands &commands ) {
    ConstMemPtr memPtr = dynamic_cast<ConstMemPtr>(tree);
    if ( memPtr ) {
        ConstConstPtr constPtr = dynamic_cast<ConstConstPtr>(memPtr->getAddress( ));
        if ( constPtr ) {
            commands.emplace_back(
                    std::make_shared<AssemblyCode::MoveMemFromConstCommand>( dest, constPtr->getValue( )));
            return true;
        }
    }
    return false;
}